

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalGenerator::WriteSummary(cmGlobalGenerator *this,cmGeneratorTarget *target)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  cmSourceFile *this_00;
  long *plVar3;
  pointer pbVar4;
  cmSourceFile **ppcVar5;
  char *pcVar6;
  Value *pVVar7;
  string *psVar8;
  Value *pVVar9;
  size_t sVar10;
  ostream *poVar11;
  const_iterator cVar12;
  pointer pbVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  string json_file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmakeDirectoryLabelsList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directoryLabelsList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string file;
  string dir;
  Value lj_root;
  cmGeneratedFileStream json_fout;
  cmGeneratedFileStream fout;
  cmSourceFile **local_710;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_708;
  Value *local_6e8;
  cmSourceFile **local_6e0;
  string local_6d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_698;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_678;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_658;
  string local_640;
  Value *local_620;
  string local_618;
  Value local_5f8;
  ValueHolder local_5d0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c0 [35];
  Value local_388;
  Value local_360;
  Value local_338;
  Value local_310;
  string local_2e8;
  Value local_2c8;
  Value local_2a0;
  undefined1 local_278 [584];
  
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_618,target);
  local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_640,local_618._M_dataplus._M_p,
             local_618._M_dataplus._M_p + local_618._M_string_length);
  std::__cxx11::string::append((char *)&local_640);
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_6d8,local_618._M_dataplus._M_p,
             local_618._M_dataplus._M_p + local_618._M_string_length);
  std::__cxx11::string::append((char *)&local_6d8);
  pcVar1 = local_278 + 0x10;
  local_278._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"LABELS","");
  pcVar6 = cmGeneratorTarget::GetProperty(target,(string *)local_278);
  if ((pointer)local_278._0_8_ != pcVar1) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  pcVar2 = target->Target->Makefile;
  local_278._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"LABELS","");
  local_6e0 = (cmSourceFile **)cmMakefile::GetProperty(pcVar2,(string *)local_278);
  if ((pointer)local_278._0_8_ != pcVar1) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  pcVar2 = target->Target->Makefile;
  local_278._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"CMAKE_DIRECTORY_LABELS","");
  local_6e8 = (Value *)cmMakefile::GetDefinition(pcVar2,(string *)local_278);
  if ((pointer)local_278._0_8_ != pcVar1) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if ((pcVar6 == (char *)0x0 && local_6e0 == (cmSourceFile **)0x0) && local_6e8 == (Value *)0x0) {
    cmsys::SystemTools::RemoveFile(&local_640);
    cmsys::SystemTools::RemoveFile(&local_6d8);
  }
  else {
    Json::Value::Value(&local_5f8,objectValue);
    Json::Value::Value(&local_310,objectValue);
    pVVar7 = Json::Value::operator[](&local_5f8,"target");
    pVVar7 = Json::Value::operator=(pVVar7,&local_310);
    Json::Value::~Value(&local_310);
    psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    Json::Value::Value(&local_338,psVar8);
    pVVar9 = Json::Value::operator[](pVVar7,"name");
    Json::Value::operator=(pVVar9,&local_338);
    Json::Value::~Value(&local_338);
    Json::Value::Value(&local_360,arrayValue);
    pVVar7 = Json::Value::operator[](pVVar7,"labels");
    pVVar7 = Json::Value::operator=(pVVar7,&local_360);
    Json::Value::~Value(&local_360);
    Json::Value::Value(&local_388,arrayValue);
    pVVar9 = Json::Value::operator[](&local_5f8,"sources");
    local_620 = Json::Value::operator=(pVVar9,&local_388);
    Json::Value::~Value(&local_388);
    cmsys::SystemTools::MakeDirectory(local_618._M_dataplus._M_p);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_278,local_640._M_dataplus._M_p,false,None);
    local_708.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_708.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_708.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pcVar6 != (char *)0x0) {
      local_5d0[0].string_ = (char *)local_5c0;
      sVar10 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5d0,pcVar6,pcVar6 + sVar10);
      cmSystemTools::ExpandListArgument((string *)local_5d0,&local_708,false);
      if (local_5d0[0] != local_5c0) {
        operator_delete(local_5d0[0].string_,local_5c0[0]._M_allocated_capacity + 1);
      }
      if ((local_708.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_708.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278,"# Target labels\n",0x10),
         local_708.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_708.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)) {
        pbVar13 = local_708.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," ",1);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_278,(pbVar13->_M_dataplus)._M_p,
                               pbVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          Json::Value::Value((Value *)local_5d0,pbVar13);
          Json::Value::append(pVVar7,(Value *)local_5d0);
          Json::Value::~Value((Value *)local_5d0);
          pbVar13 = pbVar13 + 1;
        } while (pbVar13 !=
                 local_708.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    ppcVar5 = local_6e0;
    local_698.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_698.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_698.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_6b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_6b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_6b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    if (local_6e0 != (cmSourceFile **)0x0) {
      local_5d0[0].string_ = (char *)local_5c0;
      sVar10 = strlen((char *)local_6e0);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5d0,ppcVar5,(long)ppcVar5 + sVar10);
      cmSystemTools::ExpandListArgument((string *)local_5d0,&local_698,false);
      if (local_5d0[0] != local_5c0) {
        operator_delete(local_5d0[0].string_,local_5c0[0]._M_allocated_capacity + 1);
      }
    }
    pVVar9 = local_6e8;
    if (local_6e8 != (Value *)0x0) {
      local_5d0[0].string_ = (char *)local_5c0;
      sVar10 = strlen((char *)local_6e8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5d0,pVVar9,(long)&pVVar9->value_ + sVar10);
      cmSystemTools::ExpandListArgument((string *)local_5d0,&local_6b8,false);
      if (local_5d0[0] != local_5c0) {
        operator_delete(local_5d0[0].string_,local_5c0[0]._M_allocated_capacity + 1);
      }
    }
    if (((local_698.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_698.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) ||
        (local_6b8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_6b8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)) &&
       (std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"# Directory labels\n",0x13),
       local_698.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_698.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) {
      pbVar13 = local_698.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," ",1);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_278,(pbVar13->_M_dataplus)._M_p,
                             pbVar13->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        Json::Value::Value((Value *)local_5d0,pbVar13);
        Json::Value::append(pVVar7,(Value *)local_5d0);
        Json::Value::~Value((Value *)local_5d0);
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 !=
               local_698.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_6b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_6b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar13 = local_6b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," ",1);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_278,(pbVar13->_M_dataplus)._M_p,
                             pbVar13->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        Json::Value::Value((Value *)local_5d0,pbVar13);
        Json::Value::append(pVVar7,(Value *)local_5d0);
        Json::Value::~Value((Value *)local_5d0);
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 !=
               local_6b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"# Source files and their labels\n",0x20);
    local_658.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (cmSourceFile **)0x0;
    local_658.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_658.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_678.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_678.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_678.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    cmMakefile::GetConfigurations(&local_2e8,target->Target->Makefile,&local_678,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if (local_678.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_678.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_5d0[0].string_ = (char *)local_5c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5d0,"");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_678,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0);
      if (local_5d0[0] != local_5c0) {
        operator_delete(local_5d0[0].string_,local_5c0[0]._M_allocated_capacity + 1);
      }
    }
    if (local_678.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_678.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar13 = local_678.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmGeneratorTarget::GetSourceFiles(target,&local_658,pbVar13);
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 !=
               local_678.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    cVar12 = cmRemoveDuplicates<std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                       (&local_658);
    local_710 = local_658.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    if (local_658.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != cVar12._M_current) {
      local_6e0 = cVar12._M_current;
      do {
        Json::Value::Value((Value *)local_5d0,objectValue);
        pVVar7 = Json::Value::append(local_620,(Value *)local_5d0);
        Json::Value::~Value((Value *)local_5d0);
        this_00 = *local_710;
        psVar8 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_278,(psVar8->_M_dataplus)._M_p,
                             psVar8->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        Json::Value::Value(&local_2a0,psVar8);
        pVVar9 = Json::Value::operator[](pVVar7,"file");
        Json::Value::operator=(pVVar9,&local_2a0);
        Json::Value::~Value(&local_2a0);
        local_5d0[0].string_ = (char *)local_5c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5d0,"LABELS","");
        pcVar6 = cmSourceFile::GetProperty(this_00,(string *)local_5d0);
        if (local_5d0[0] != local_5c0) {
          operator_delete(local_5d0[0].string_,local_5c0[0]._M_allocated_capacity + 1);
        }
        pbVar4 = local_708.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar13 = local_708.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pcVar6 != (char *)0x0) {
          if (local_708.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_708.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar14 = &(local_708.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            local_6e8 = pVVar7;
            do {
              plVar3 = (long *)(((string *)(paVar14 + -1))->_M_dataplus)._M_p;
              if (paVar14 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar3) {
                operator_delete(plVar3,paVar14->_M_allocated_capacity + 1);
              }
              psVar8 = (string *)(paVar14 + 1);
              paVar14 = paVar14 + 2;
            } while (psVar8 != pbVar4);
            local_708.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar13;
            pVVar7 = local_6e8;
          }
          Json::Value::Value(&local_2c8,arrayValue);
          pVVar7 = Json::Value::operator[](pVVar7,"labels");
          pVVar7 = Json::Value::operator=(pVVar7,&local_2c8);
          Json::Value::~Value(&local_2c8);
          local_5d0[0].string_ = (char *)local_5c0;
          sVar10 = strlen(pcVar6);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5d0,pcVar6,pcVar6 + sVar10);
          cmSystemTools::ExpandListArgument((string *)local_5d0,&local_708,false);
          psVar8 = local_708.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (local_5d0[0] != local_5c0) {
            operator_delete(local_5d0[0].string_,local_5c0[0]._M_allocated_capacity + 1);
            psVar8 = local_708.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
          for (; psVar8 != local_708.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish; psVar8 = psVar8 + 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," ",1);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_278,(psVar8->_M_dataplus)._M_p,
                                 psVar8->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            Json::Value::Value((Value *)local_5d0,psVar8);
            Json::Value::append(pVVar7,(Value *)local_5d0);
            Json::Value::~Value((Value *)local_5d0);
          }
        }
        local_710 = local_710 + 1;
      } while (local_710 != local_6e0);
    }
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_5d0,local_6d8._M_dataplus._M_p,false,None);
    Json::operator<<((ostream *)local_5d0,&local_5f8);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_5d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_678);
    if (local_658.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (cmSourceFile **)0x0) {
      operator_delete(local_658.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_658.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_658.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_6b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_698);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_708);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
    Json::Value::~Value(&local_5f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != &local_640.field_2) {
    operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::WriteSummary(cmGeneratorTarget* target)
{
  // Place the labels file in a per-target support directory.
  std::string dir = target->GetSupportDirectory();
  std::string file = dir;
  file += "/Labels.txt";
  std::string json_file = dir + "/Labels.json";

#ifdef CMAKE_BUILD_WITH_CMAKE
  // Check whether labels are enabled for this target.
  const char* targetLabels = target->GetProperty("LABELS");
  const char* directoryLabels =
    target->Target->GetMakefile()->GetProperty("LABELS");
  const char* cmakeDirectoryLabels =
    target->Target->GetMakefile()->GetDefinition("CMAKE_DIRECTORY_LABELS");
  if (targetLabels || directoryLabels || cmakeDirectoryLabels) {
    Json::Value lj_root(Json::objectValue);
    Json::Value& lj_target = lj_root["target"] = Json::objectValue;
    lj_target["name"] = target->GetName();
    Json::Value& lj_target_labels = lj_target["labels"] = Json::arrayValue;
    Json::Value& lj_sources = lj_root["sources"] = Json::arrayValue;

    cmSystemTools::MakeDirectory(dir.c_str());
    cmGeneratedFileStream fout(file.c_str());

    std::vector<std::string> labels;

    // List the target-wide labels.  All sources in the target get
    // these labels.
    if (targetLabels) {
      cmSystemTools::ExpandListArgument(targetLabels, labels);
      if (!labels.empty()) {
        fout << "# Target labels\n";
        for (std::vector<std::string>::const_iterator li = labels.begin();
             li != labels.end(); ++li) {
          fout << " " << *li << "\n";
          lj_target_labels.append(*li);
        }
      }
    }

    // List directory labels
    std::vector<std::string> directoryLabelsList;
    std::vector<std::string> cmakeDirectoryLabelsList;

    if (directoryLabels) {
      cmSystemTools::ExpandListArgument(directoryLabels, directoryLabelsList);
    }

    if (cmakeDirectoryLabels) {
      cmSystemTools::ExpandListArgument(cmakeDirectoryLabels,
                                        cmakeDirectoryLabelsList);
    }

    if (!directoryLabelsList.empty() || !cmakeDirectoryLabelsList.empty()) {
      fout << "# Directory labels\n";
    }

    for (std::vector<std::string>::const_iterator li =
           directoryLabelsList.begin();
         li != directoryLabelsList.end(); ++li) {
      fout << " " << *li << "\n";
      lj_target_labels.append(*li);
    }

    for (std::vector<std::string>::const_iterator li =
           cmakeDirectoryLabelsList.begin();
         li != cmakeDirectoryLabelsList.end(); ++li) {
      fout << " " << *li << "\n";
      lj_target_labels.append(*li);
    }

    // List the source files with any per-source labels.
    fout << "# Source files and their labels\n";
    std::vector<cmSourceFile*> sources;
    std::vector<std::string> configs;
    target->Target->GetMakefile()->GetConfigurations(configs);
    if (configs.empty()) {
      configs.push_back("");
    }
    for (std::vector<std::string>::const_iterator ci = configs.begin();
         ci != configs.end(); ++ci) {
      target->GetSourceFiles(sources, *ci);
    }
    std::vector<cmSourceFile*>::const_iterator sourcesEnd =
      cmRemoveDuplicates(sources);
    for (std::vector<cmSourceFile*>::const_iterator si = sources.begin();
         si != sourcesEnd; ++si) {
      Json::Value& lj_source = lj_sources.append(Json::objectValue);
      cmSourceFile* sf = *si;
      std::string const& sfp = sf->GetFullPath();
      fout << sfp << "\n";
      lj_source["file"] = sfp;
      if (const char* svalue = sf->GetProperty("LABELS")) {
        labels.clear();
        Json::Value& lj_source_labels = lj_source["labels"] = Json::arrayValue;
        cmSystemTools::ExpandListArgument(svalue, labels);
        for (std::vector<std::string>::const_iterator li = labels.begin();
             li != labels.end(); ++li) {
          fout << " " << *li << "\n";
          lj_source_labels.append(*li);
        }
      }
    }
    cmGeneratedFileStream json_fout(json_file.c_str());
    json_fout << lj_root;
  } else
#endif
  {
    cmSystemTools::RemoveFile(file);
    cmSystemTools::RemoveFile(json_file);
  }
}